

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

ssize_t __thiscall PosixRunWriter::write(PosixRunWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ulong in_RAX;
  ulong extraout_RAX;
  ulong uVar2;
  ulong uVar3;
  undefined8 uStack_38;
  
  uVar2 = ~this->prev_ + (ulong)(uint)__fd;
  uStack_38 = in_RAX;
  if (0x7f < (long)uVar2) {
    uVar3 = uVar2;
    do {
      this->out_bytes_ = this->out_bytes_ + 1;
      uStack_38 = CONCAT17(uStack_38._7_1_,CONCAT16((char)uVar3,(undefined6)uStack_38)) |
                  0x80000000000000;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->buffer_,(uchar *)((long)&uStack_38 + 6));
      uVar2 = uVar3 >> 7;
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar2;
    } while (bVar1);
  }
  this->out_bytes_ = this->out_bytes_ + 1;
  uStack_38 = CONCAT17((char)uVar2,(undefined7)uStack_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->buffer_,(uchar *)((long)&uStack_38 + 7));
  this->prev_ = (ulong)(uint)__fd;
  uVar2 = (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (0x8000000 < uVar2) {
    flush(this);
    uVar2 = extraout_RAX;
  }
  return uVar2;
}

Assistant:

void PosixRunWriter::write(FileId next) {
    assert(next > prev_);
    int64_t diff = (next - prev_) - 1;
    while (diff >= 0x80U) {
        out_bytes_++;
        buffer_.push_back(static_cast<uint8_t>(0x80U | (diff & 0x7FU)));
        diff >>= 7;
    }
    out_bytes_++;
    buffer_.push_back(static_cast<uint8_t>(diff));
    prev_ = next;

    if (buffer_.size() > RUN_BUFFER_SIZE) {
        flush();
    }
}